

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

oonf_stream_session_state
dlep_session_process_tcp(oonf_stream_session *tcp_session,dlep_session *session)

{
  size_t len;
  ssize_t processed;
  dlep_session *session_local;
  oonf_stream_session *tcp_session_local;
  
  if ((log_global_mask[session->log_source] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,session->log_source,"src/generic/dlep/dlep_session.c",0x123,
             (void *)0x0,0,"Process TCP buffer of %zu bytes",(tcp_session->in)._len);
  }
  len = dlep_session_process_buffer(session,(tcp_session->in)._buf,(tcp_session->in)._len,false);
  if ((long)len < 0) {
    tcp_session_local._4_4_ = STREAM_SESSION_CLEANUP;
  }
  else if (session->restrict_signal == DLEP_KILL_SESSION) {
    tcp_session_local._4_4_ = STREAM_SESSION_CLEANUP;
  }
  else {
    if ((log_global_mask[session->log_source] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,session->log_source,"src/generic/dlep/dlep_session.c",0x130,
               (void *)0x0,0,"Processed %zd bytes",len);
    }
    abuf_pull(&tcp_session->in,len);
    if (((session->writer).out)->_len != 0) {
      if ((log_global_mask[session->log_source] & 1) != 0) {
        oonf_log(LOG_SEVERITY_DEBUG,session->log_source,"src/generic/dlep/dlep_session.c",0x136,
                 (void *)0x0,0,"Trigger sending %zu bytes",((session->writer).out)->_len);
      }
      oonf_stream_flush(tcp_session);
    }
    if (session->restrict_signal == DLEP_KILL_SESSION) {
      tcp_session_local._4_4_ = STREAM_SESSION_CLEANUP;
    }
    else {
      tcp_session_local._4_4_ = STREAM_SESSION_ACTIVE;
    }
  }
  return tcp_session_local._4_4_;
}

Assistant:

enum oonf_stream_session_state
dlep_session_process_tcp(struct oonf_stream_session *tcp_session, struct dlep_session *session)
{
  ssize_t processed;

  OONF_DEBUG(
    session->log_source, "Process TCP buffer of %" PRINTF_SIZE_T_SPECIFIER " bytes", abuf_getlen(&tcp_session->in));

  processed = dlep_session_process_buffer(session, abuf_getptr(&tcp_session->in), abuf_getlen(&tcp_session->in), false);

  if (processed < 0) {
    /* session is most likely invalid now */
    return STREAM_SESSION_CLEANUP;
  }

  if (session->restrict_signal == DLEP_KILL_SESSION) {
    return STREAM_SESSION_CLEANUP;
  }

  OONF_DEBUG(session->log_source, "Processed %" PRINTF_SSIZE_T_SPECIFIER " bytes", processed);

  abuf_pull(&tcp_session->in, processed);

  if (abuf_getlen(session->writer.out) > 0) {
    OONF_DEBUG(
      session->log_source, "Trigger sending %" PRINTF_SIZE_T_SPECIFIER " bytes", abuf_getlen(session->writer.out));

    /* send answer */
    oonf_stream_flush(tcp_session);
  }

  if (session->restrict_signal == DLEP_KILL_SESSION) {
    return STREAM_SESSION_CLEANUP;
  }
  return STREAM_SESSION_ACTIVE;
}